

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelets.cpp
# Opt level: O3

void lts2::WaveletTransform2D
               (Mat *src,Mat *dest,double *P,double *Q,int fsize,int *ww,int *wh,int stop_after)

{
  uint uVar1;
  pointer pMVar2;
  undefined8 uVar3;
  pointer pMVar4;
  ulong uVar5;
  ulong uVar6;
  uint n;
  uint uVar7;
  uint n_00;
  ulong uVar8;
  bool bVar9;
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_b8;
  double *local_98;
  double *local_90;
  Mat *local_88;
  uint *local_80;
  uint *local_78;
  ulong local_70;
  uint local_68;
  uint local_64;
  _OutputArray local_60;
  _InputArray local_48;
  
  local_98 = P;
  local_90 = Q;
  local_78 = (uint *)ww;
  if (*(long *)(src + 0x10) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"gmg_WaveletTransform2D() src == NULL",0x24);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
    return;
  }
  local_80 = (uint *)wh;
  n = **(uint **)(src + 0x40);
  n_00 = (*(uint **)(src + 0x40))[1];
  uVar1 = n;
  if ((int)n < (int)n_00) {
    uVar1 = n_00;
  }
  if (-1 < stop_after) {
    uVar1 = stop_after;
  }
  local_88 = dest;
  local_68 = n_00;
  local_64 = n;
  cv::Mat::create(dest,&local_68,*(uint *)src & 0xfff);
  local_60.super__InputArray.obj = &local_b8;
  local_b8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_b8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_b8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48.sz.width = 0;
  local_48.sz.height = 0;
  local_48.flags = 0x1010000;
  local_60.super__InputArray.sz.width = 0;
  local_60.super__InputArray.sz.height = 0;
  local_60.super__InputArray.flags = 0x2050000;
  local_48.obj = src;
  cv::split(&local_48,&local_60);
  if (((((n_00 & 1) == 0) && (fsize <= (int)n_00)) && (fsize <= (int)n)) &&
     (((n & 1) == 0 && (0 < (int)uVar1)))) {
    uVar5 = 0;
    pMVar2 = local_b8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
             super__Vector_impl_data._M_start;
    pMVar4 = local_b8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
             super__Vector_impl_data._M_finish;
    do {
      bVar9 = pMVar4 != pMVar2;
      pMVar4 = pMVar2;
      if (bVar9) {
        uVar8 = 0;
        local_70 = uVar5;
        do {
          if (0 < (int)n) {
            uVar7 = 0;
            do {
              uVar5 = ((long)local_b8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)local_b8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                             super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
              if (uVar5 < uVar8 || uVar5 - uVar8 == 0) {
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar8);
                goto LAB_001100a0;
              }
              Wavegeneral_h(local_b8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start + uVar8 * 0x60,uVar7,n_00,0,local_98,
                            local_90,fsize);
              uVar7 = uVar7 + 1;
            } while (n != uVar7);
          }
          uVar5 = local_70;
          if (0 < (int)n_00) {
            uVar7 = 0;
            do {
              uVar6 = ((long)local_b8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)local_b8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                             super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
              if (uVar6 < uVar8 || uVar6 - uVar8 == 0) {
LAB_001100a0:
                uVar3 = std::__throw_out_of_range_fmt
                                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                   ,uVar8);
                std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_b8);
                _Unwind_Resume(uVar3);
              }
              Wavegeneral_v(local_b8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start + uVar8 * 0x60,uVar7,n,0,local_98,
                            local_90,fsize);
              uVar7 = uVar7 + 1;
            } while (n_00 != uVar7);
          }
          uVar8 = uVar8 + 1;
          uVar6 = ((long)local_b8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_b8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                         super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
          pMVar2 = local_b8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pMVar4 = local_b8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        } while (uVar8 <= uVar6 && uVar6 - uVar8 != 0);
      }
      *local_80 = n;
      *local_78 = n_00;
    } while ((((n_00 & 2) == 0) && (n_00 = (int)n_00 >> 1, fsize <= (int)n_00)) &&
            ((fsize <= (int)n >> 1 &&
             (((n & 2) == 0 &&
              (uVar7 = (int)uVar5 + 1, uVar5 = (ulong)uVar7, n = (int)n >> 1,
              (int)uVar7 < (int)uVar1))))));
  }
  local_48.sz.width = 0;
  local_48.sz.height = 0;
  local_48.flags = 0x1050000;
  local_48.obj = &local_b8;
  local_60.super__InputArray.sz.width = 0;
  local_60.super__InputArray.sz.height = 0;
  local_60.super__InputArray.flags = 0x2010000;
  local_60.super__InputArray.obj = local_88;
  cv::merge(&local_48,&local_60);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_b8);
  return;
}

Assistant:

void lts2::WaveletTransform2D(const cv::Mat& src, cv::Mat& dest, 
                              double *P, double *Q, int fsize, int *ww, int *wh, int stop_after)
{
  if (!src.data) 
  {
    std::cerr << "gmg_WaveletTransform2D() src == NULL" << std::endl;
    return;
  }
	
  cv::Size imageSize = src.size();
    
  int input_w = imageSize.width;
  int input_h = imageSize.height;
	
  if (stop_after < 0) 
    stop_after = MAX(input_w, input_h);
	
  dest.create(imageSize, src.type());
	
  int width = imageSize.width;//XBDW(src)-XBUP(src);
  int height = imageSize.height;//YBDW(src)-YBUP(src);
	
  std::vector<cv::Mat> components;
  cv::split(src, components);
	
  int loop_count = 0;
  while(width>=fsize && height>=fsize && !(width%2) && !(height%2) && loop_count < stop_after) 
  {
		
    for(int b = 0; b < components.size(); ++b) 
    {
      for(int k = 0; k < height; ++k)
        Wavegeneral_h(components.at(b), k, width, 0, P, Q, fsize);
      for(int k = 0; k < width; ++k)
        Wavegeneral_v(components.at(b), k, height, 0, P, Q, fsize);
    }
        
    *wh = height;
    *ww = width;
		
    width /= 2; 
    height /= 2;
		
    ++loop_count;    
  }
	
  cv::merge(components, dest);
}